

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pospopcnt.c
# Opt level: O2

int pospopcnt_u16_sse_blend_popcnt_unroll4(uint16_t *array,uint32_t len,uint32_t *flags)

{
  ulong uVar1;
  int *piVar2;
  ushort uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  byte bVar64;
  byte bVar65;
  byte bVar66;
  byte bVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  long lVar70;
  ulong uVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  
  auVar69 = _DAT_00114070;
  auVar68 = _DAT_00114060;
  uVar71 = 0;
  while (uVar1 = uVar71 + 4, uVar1 <= len >> 3) {
    lVar70 = 0x20;
    auVar72 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar71 * 8),auVar68,
                                *(undefined1 (*) [16])(array + uVar71 * 8 + 8));
    auVar73 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar71 * 8 + 8),auVar69,
                                *(undefined1 (*) [16])(array + uVar71 * 8));
    auVar74 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar71 * 8 + 0x10),auVar68,
                                *(undefined1 (*) [16])(array + uVar71 * 8 + 0x18));
    auVar75 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar71 * 8 + 0x18),auVar69,
                                *(undefined1 (*) [16])(array + uVar71 * 8 + 0x10));
    for (; uVar71 = uVar1, lVar70 != 0; lVar70 = lVar70 + -4) {
      auVar4 = auVar72 >> 7;
      auVar8 = auVar72 >> 0xf;
      auVar12 = auVar72 >> 0x17;
      auVar16 = auVar72 >> 0x1f;
      auVar20 = auVar72 >> 0x27;
      auVar24 = auVar72 >> 0x2f;
      auVar28 = auVar72 >> 0x37;
      auVar32 = auVar72 >> 0x3f;
      auVar36 = auVar72 >> 0x47;
      auVar40 = auVar72 >> 0x4f;
      auVar44 = auVar72 >> 0x57;
      auVar48 = auVar72 >> 0x5f;
      auVar52 = auVar72 >> 0x67;
      auVar56 = auVar72 >> 0x6f;
      auVar60 = auVar72 >> 0x77;
      bVar64 = auVar72[0xf];
      auVar5 = auVar73 >> 7;
      auVar9 = auVar73 >> 0xf;
      auVar13 = auVar73 >> 0x17;
      auVar17 = auVar73 >> 0x1f;
      auVar21 = auVar73 >> 0x27;
      auVar25 = auVar73 >> 0x2f;
      auVar29 = auVar73 >> 0x37;
      auVar33 = auVar73 >> 0x3f;
      auVar37 = auVar73 >> 0x47;
      auVar41 = auVar73 >> 0x4f;
      auVar45 = auVar73 >> 0x57;
      auVar49 = auVar73 >> 0x5f;
      auVar53 = auVar73 >> 0x67;
      auVar57 = auVar73 >> 0x6f;
      auVar61 = auVar73 >> 0x77;
      bVar65 = auVar73[0xf];
      auVar6 = auVar74 >> 7;
      auVar10 = auVar74 >> 0xf;
      auVar14 = auVar74 >> 0x17;
      auVar18 = auVar74 >> 0x1f;
      auVar22 = auVar74 >> 0x27;
      auVar26 = auVar74 >> 0x2f;
      auVar30 = auVar74 >> 0x37;
      auVar34 = auVar74 >> 0x3f;
      auVar38 = auVar74 >> 0x47;
      auVar42 = auVar74 >> 0x4f;
      auVar46 = auVar74 >> 0x57;
      auVar50 = auVar74 >> 0x5f;
      auVar54 = auVar74 >> 0x67;
      auVar58 = auVar74 >> 0x6f;
      auVar62 = auVar74 >> 0x77;
      bVar66 = auVar74[0xf];
      auVar72 = vpaddb_avx(auVar72,auVar72);
      auVar73 = vpaddb_avx(auVar73,auVar73);
      auVar74 = vpaddb_avx(auVar74,auVar74);
      auVar7 = auVar75 >> 7;
      auVar11 = auVar75 >> 0xf;
      auVar15 = auVar75 >> 0x17;
      auVar19 = auVar75 >> 0x1f;
      auVar23 = auVar75 >> 0x27;
      auVar27 = auVar75 >> 0x2f;
      auVar31 = auVar75 >> 0x37;
      auVar35 = auVar75 >> 0x3f;
      auVar39 = auVar75 >> 0x47;
      auVar43 = auVar75 >> 0x4f;
      auVar47 = auVar75 >> 0x57;
      auVar51 = auVar75 >> 0x5f;
      auVar55 = auVar75 >> 0x67;
      auVar59 = auVar75 >> 0x6f;
      auVar63 = auVar75 >> 0x77;
      bVar67 = auVar75[0xf];
      auVar75 = vpaddb_avx(auVar75,auVar75);
      *(int *)((long)flags + lVar70 + -4) =
           POPCOUNT((uint)(ushort)((ushort)(auVar6[0] & 1) | (ushort)(auVar10[0] & 1) << 1 |
                                   (ushort)(auVar14[0] & 1) << 2 | (ushort)(auVar18[0] & 1) << 3 |
                                   (ushort)(auVar22[0] & 1) << 4 | (ushort)(auVar26[0] & 1) << 5 |
                                   (ushort)(auVar30[0] & 1) << 6 | (ushort)(auVar34[0] & 1) << 7 |
                                   (ushort)(auVar38[0] & 1) << 8 | (ushort)(auVar42[0] & 1) << 9 |
                                   (ushort)(auVar46[0] & 1) << 10 | (ushort)(auVar50[0] & 1) << 0xb
                                   | (ushort)(auVar54[0] & 1) << 0xc |
                                   (ushort)(auVar58[0] & 1) << 0xd | (ushort)(auVar62[0] & 1) << 0xe
                                  | (ushort)(bVar66 >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(auVar4[0] & 1) | (ushort)(auVar8[0] & 1) << 1 |
                                   (ushort)(auVar12[0] & 1) << 2 | (ushort)(auVar16[0] & 1) << 3 |
                                   (ushort)(auVar20[0] & 1) << 4 | (ushort)(auVar24[0] & 1) << 5 |
                                   (ushort)(auVar28[0] & 1) << 6 | (ushort)(auVar32[0] & 1) << 7 |
                                   (ushort)(auVar36[0] & 1) << 8 | (ushort)(auVar40[0] & 1) << 9 |
                                   (ushort)(auVar44[0] & 1) << 10 | (ushort)(auVar48[0] & 1) << 0xb
                                   | (ushort)(auVar52[0] & 1) << 0xc |
                                   (ushort)(auVar56[0] & 1) << 0xd | (ushort)(auVar60[0] & 1) << 0xe
                                  | (ushort)(bVar64 >> 7) << 0xf)) +
           *(int *)((long)flags + lVar70 + -4);
      *(int *)((long)flags + lVar70 + 0x1c) =
           POPCOUNT((uint)(ushort)((ushort)(auVar7[0] & 1) | (ushort)(auVar11[0] & 1) << 1 |
                                   (ushort)(auVar15[0] & 1) << 2 | (ushort)(auVar19[0] & 1) << 3 |
                                   (ushort)(auVar23[0] & 1) << 4 | (ushort)(auVar27[0] & 1) << 5 |
                                   (ushort)(auVar31[0] & 1) << 6 | (ushort)(auVar35[0] & 1) << 7 |
                                   (ushort)(auVar39[0] & 1) << 8 | (ushort)(auVar43[0] & 1) << 9 |
                                   (ushort)(auVar47[0] & 1) << 10 | (ushort)(auVar51[0] & 1) << 0xb
                                   | (ushort)(auVar55[0] & 1) << 0xc |
                                   (ushort)(auVar59[0] & 1) << 0xd | (ushort)(auVar63[0] & 1) << 0xe
                                  | (ushort)(bVar67 >> 7) << 0xf)) +
           POPCOUNT((uint)(ushort)((ushort)(auVar5[0] & 1) | (ushort)(auVar9[0] & 1) << 1 |
                                   (ushort)(auVar13[0] & 1) << 2 | (ushort)(auVar17[0] & 1) << 3 |
                                   (ushort)(auVar21[0] & 1) << 4 | (ushort)(auVar25[0] & 1) << 5 |
                                   (ushort)(auVar29[0] & 1) << 6 | (ushort)(auVar33[0] & 1) << 7 |
                                   (ushort)(auVar37[0] & 1) << 8 | (ushort)(auVar41[0] & 1) << 9 |
                                   (ushort)(auVar45[0] & 1) << 10 | (ushort)(auVar49[0] & 1) << 0xb
                                   | (ushort)(auVar53[0] & 1) << 0xc |
                                   (ushort)(auVar57[0] & 1) << 0xd | (ushort)(auVar61[0] & 1) << 0xe
                                  | (ushort)(bVar65 >> 7) << 0xf)) +
           *(int *)((long)flags + lVar70 + 0x1c);
    }
  }
  while (uVar1 = uVar71 + 2, uVar1 <= len >> 3) {
    lVar70 = 0x20;
    auVar72 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar71 * 8),auVar68,
                                *(undefined1 (*) [16])(array + uVar71 * 8 + 8));
    auVar73 = vpermt2b_avx512vl(*(undefined1 (*) [16])(array + uVar71 * 8 + 8),auVar69,
                                *(undefined1 (*) [16])(array + uVar71 * 8));
    for (; uVar71 = uVar1, lVar70 != 0; lVar70 = lVar70 + -4) {
      auVar74 = auVar72 >> 7;
      auVar75 = auVar72 >> 0xf;
      auVar4 = auVar72 >> 0x17;
      auVar5 = auVar72 >> 0x1f;
      auVar6 = auVar72 >> 0x27;
      auVar7 = auVar72 >> 0x2f;
      auVar8 = auVar72 >> 0x37;
      auVar9 = auVar72 >> 0x3f;
      auVar10 = auVar72 >> 0x47;
      auVar11 = auVar72 >> 0x4f;
      auVar12 = auVar72 >> 0x57;
      auVar13 = auVar72 >> 0x5f;
      auVar14 = auVar72 >> 0x67;
      auVar15 = auVar72 >> 0x6f;
      auVar16 = auVar72 >> 0x77;
      bVar64 = auVar72[0xf];
      auVar72 = vpaddb_avx(auVar72,auVar72);
      piVar2 = (int *)((long)flags + lVar70 + -4);
      *piVar2 = *piVar2 + POPCOUNT((uint)(ushort)((ushort)(auVar74[0] & 1) |
                                                  (ushort)(auVar75[0] & 1) << 1 |
                                                  (ushort)(auVar4[0] & 1) << 2 |
                                                  (ushort)(auVar5[0] & 1) << 3 |
                                                  (ushort)(auVar6[0] & 1) << 4 |
                                                  (ushort)(auVar7[0] & 1) << 5 |
                                                  (ushort)(auVar8[0] & 1) << 6 |
                                                  (ushort)(auVar9[0] & 1) << 7 |
                                                  (ushort)(auVar10[0] & 1) << 8 |
                                                  (ushort)(auVar11[0] & 1) << 9 |
                                                  (ushort)(auVar12[0] & 1) << 10 |
                                                  (ushort)(auVar13[0] & 1) << 0xb |
                                                  (ushort)(auVar14[0] & 1) << 0xc |
                                                  (ushort)(auVar15[0] & 1) << 0xd |
                                                  (ushort)(auVar16[0] & 1) << 0xe |
                                                 (ushort)(bVar64 >> 7) << 0xf));
      auVar74 = auVar73 >> 7;
      auVar75 = auVar73 >> 0xf;
      auVar4 = auVar73 >> 0x17;
      auVar5 = auVar73 >> 0x1f;
      auVar6 = auVar73 >> 0x27;
      auVar7 = auVar73 >> 0x2f;
      auVar8 = auVar73 >> 0x37;
      auVar9 = auVar73 >> 0x3f;
      auVar10 = auVar73 >> 0x47;
      auVar11 = auVar73 >> 0x4f;
      auVar12 = auVar73 >> 0x57;
      auVar13 = auVar73 >> 0x5f;
      auVar14 = auVar73 >> 0x67;
      auVar15 = auVar73 >> 0x6f;
      auVar16 = auVar73 >> 0x77;
      bVar64 = auVar73[0xf];
      auVar73 = vpaddb_avx(auVar73,auVar73);
      piVar2 = (int *)((long)flags + lVar70 + 0x1c);
      *piVar2 = *piVar2 + POPCOUNT((uint)(ushort)((ushort)(auVar74[0] & 1) |
                                                  (ushort)(auVar75[0] & 1) << 1 |
                                                  (ushort)(auVar4[0] & 1) << 2 |
                                                  (ushort)(auVar5[0] & 1) << 3 |
                                                  (ushort)(auVar6[0] & 1) << 4 |
                                                  (ushort)(auVar7[0] & 1) << 5 |
                                                  (ushort)(auVar8[0] & 1) << 6 |
                                                  (ushort)(auVar9[0] & 1) << 7 |
                                                  (ushort)(auVar10[0] & 1) << 8 |
                                                  (ushort)(auVar11[0] & 1) << 9 |
                                                  (ushort)(auVar12[0] & 1) << 10 |
                                                  (ushort)(auVar13[0] & 1) << 0xb |
                                                  (ushort)(auVar14[0] & 1) << 0xc |
                                                  (ushort)(auVar15[0] & 1) << 0xd |
                                                  (ushort)(auVar16[0] & 1) << 0xe |
                                                 (ushort)(bVar64 >> 7) << 0xf));
    }
  }
  for (uVar71 = uVar71 << 3; uVar71 < len; uVar71 = uVar71 + 1) {
    uVar3 = array[uVar71];
    for (lVar70 = 0; lVar70 != 0x10; lVar70 = lVar70 + 1) {
      flags[lVar70] = flags[lVar70] + (uint)((uVar3 >> ((uint)lVar70 & 0x1f) & 1) != 0);
    }
  }
  return 0;
}

Assistant:

int pospopcnt_u16_sse_blend_popcnt_unroll4(const uint16_t* array, uint32_t len, uint32_t* flags) {
    const __m128i* data_vectors = (const __m128i*)(array);
    const uint32_t n_cycles = len / 8;

    size_t i = 0;
    for (/**/; i + 4 <= n_cycles; i += 4) {
#define L(p) __m128i v##p =  _mm_loadu_si128(data_vectors+i+p);
        L(0) L(1) L(2) L(3)

#define U0(p,k) __m128i input##p = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16(0x00FF)), _mm_slli_epi16(v##k, 8));
#define U1(p,k) __m128i input##k = _mm_or_si128(_mm_and_si128(v##p, _mm_set1_epi16((int16_t)0xFF00)), _mm_srli_epi16(v##k, 8));
#define U(p, k)  U0(p,k) U1(p,k)

        U(0,1) U(2,3)
        
        for (int i = 0; i < 8; ++i) {
#define A0(p) flags[ 7 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##p));
#define A1(k) flags[15 - i] += _mm_popcnt_u32(_mm_movemask_epi8(input##k));
#define A(p, k) A0(p) A1(k)
            A(0,1) A(2, 3)

#define P0(p) input##p = _mm_add_epi8(input##p, input##p);
#define P(p, k) P0(p) P0(k)
            P(0,1) P(2, 3)
        }
    }

    for (/**/; i + 2 <= n_cycles; i += 2) {
        L(0) L(1)
        U(0,1)
        
        for (int i = 0; i < 8; ++i) {
            A(0,1)
            P(0,1)
        }
    }

    i *= 8;
    for (/**/; i < len; ++i) {
        for (int j = 0; j < 16; ++j) {
            flags[j] += ((array[i] & (1 << j)) >> j);
        }
    }

#undef L
#undef U0
#undef U1
#undef U
#undef A0
#undef A1
#undef A
#undef P0
#undef P
    
    return 0;
}